

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempLivnessFiller.cpp
# Opt level: O3

int processCodeLine(CodeLine *codeLine)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  pointer ppCVar1;
  CodeLine *pCVar2;
  pointer pcVar3;
  size_type sVar4;
  pointer pCVar5;
  int iVar6;
  iterator iVar7;
  _Base_ptr p_Var8;
  _Alloc_hider _Var9;
  pointer pCVar10;
  pointer ppCVar11;
  bool bVar12;
  CTemp useTemp;
  CTemp outTemp;
  int local_d4;
  key_type local_d0;
  _Base_ptr local_b0;
  CodeLine *local_a8;
  string local_a0;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  string local_68;
  vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> local_48;
  
  (**((codeLine->command).
      super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_AssemblyCommand)(&local_68);
  sVar4 = local_68._M_string_length;
  local_a8 = codeLine;
  if (local_68._M_dataplus._M_p == (pointer)local_68._M_string_length) {
    local_d4 = 0;
  }
  else {
    local_b0 = &(codeLine->liveInTemps)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_d4 = 0;
    _Var9._M_p = local_68._M_dataplus._M_p;
    do {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,*(long *)_Var9._M_p,
                 *(long *)((long)_Var9._M_p + 8) + *(long *)_Var9._M_p);
      IRT::CTemp::ToString_abi_cxx11_(&local_a0,(CTemp *)&local_d0);
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(codeLine->liveInTemps)._M_t,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if (iVar7._M_node == local_b0) {
        IRT::CTemp::ToString_abi_cxx11_(&local_a0,(CTemp *)&local_d0);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&codeLine->liveInTemps,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        local_d4 = local_d4 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      _Var9._M_p = _Var9._M_p + 0x20;
    } while (_Var9._M_p != (pointer)sVar4);
  }
  std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::~vector
            ((vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *)&local_68);
  p_Var8 = (local_a8->liveInTemps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_78 = &(local_a8->liveInTemps)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var8 != local_78) {
    do {
      pCVar2 = local_a8;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,*(long *)(p_Var8 + 1),
                 (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
      ppCVar1 = (pCVar2->prevLines).
                super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppCVar11 = (pCVar2->prevLines).
                      super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppCVar11 != ppCVar1;
          ppCVar11 = ppCVar11 + 1) {
        pCVar2 = *ppCVar11;
        this = &pCVar2->liveOutTemps;
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&this->_M_t,&local_d0);
        if ((_Rb_tree_header *)iVar7._M_node ==
            &(pCVar2->liveOutTemps)._M_t._M_impl.super__Rb_tree_header) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this,&local_d0);
          local_d4 = local_d4 + 1;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != local_78);
  }
  local_b0 = (local_a8->liveOutTemps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_70 = &(local_a8->liveOutTemps)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_b0 != local_70) {
    local_80 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_a8->liveInTemps;
    do {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,*(long *)(local_b0 + 1),
                 (long)&(local_b0[1]._M_parent)->_M_color + *(long *)(local_b0 + 1));
      (*((local_a8->command).
         super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_AssemblyCommand[1])(&local_48);
      pCVar5 = local_48.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pCVar10 = local_48.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
                     super__Vector_impl_data._M_start; pCVar10 != pCVar5; pCVar10 = pCVar10 + 1) {
        pcVar3 = (pCVar10->name)._M_dataplus._M_p;
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,pcVar3,pcVar3 + (pCVar10->name)._M_string_length);
        IRT::CTemp::ToString_abi_cxx11_(&local_68,(CTemp *)&local_a0);
        _Var9._M_p = local_68._M_dataplus._M_p;
        if (local_68._M_string_length == local_d0._M_string_length) {
          if ((long *)local_68._M_string_length == (long *)0x0) {
            bVar12 = true;
          }
          else {
            iVar6 = bcmp(local_68._M_dataplus._M_p,local_d0._M_dataplus._M_p,
                         local_68._M_string_length);
            bVar12 = iVar6 == 0;
          }
        }
        else {
          bVar12 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_68.field_2) {
          operator_delete(_Var9._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        if (bVar12) {
          std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::~vector(&local_48);
          goto LAB_001537b7;
        }
      }
      std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::~vector(&local_48);
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_80,&local_d0);
      if (iVar7._M_node == local_78) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>(local_80,&local_d0);
        local_d4 = local_d4 + 1;
      }
LAB_001537b7:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      local_b0 = (_Base_ptr)std::_Rb_tree_increment(local_b0);
    } while (local_b0 != local_70);
  }
  return local_d4;
}

Assistant:

int processCodeLine(AssemblyCode::CodeLine* codeLine) {
    int changesCount = 0;

    for (auto useTemp : codeLine->command->GetIn()) {
        if (codeLine->liveInTemps.find(useTemp.ToString()) == codeLine->liveInTemps.end()) {
            changesCount += 1;
            codeLine->liveInTemps.insert(useTemp.ToString());
        }
    }

    for (auto liveInTemp : codeLine->liveInTemps) {
        for (auto prevLine : codeLine->prevLines) {
            if (prevLine->liveOutTemps.find(liveInTemp) == prevLine->liveOutTemps.end()) {
                changesCount += 1;
                prevLine->liveOutTemps.insert(liveInTemp);
            }
        }
    }

    for (auto liveOutTemp : codeLine->liveOutTemps) {
        bool found = false;
        for (auto outTemp : codeLine->command->GetOut()) {
            if (outTemp.ToString() == liveOutTemp) {
                found = true;
                break;
            }
        }

        if (!found) {
            if (codeLine->liveInTemps.find(liveOutTemp) == codeLine->liveInTemps.end()) {
                changesCount += 1;
                codeLine->liveInTemps.insert(liveOutTemp);
            }
        }
    }

    return changesCount;
}